

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<anurbs::KnotRefinement<2L>_> * __thiscall
pybind11::class_<anurbs::KnotRefinement<2l>>::
def_static<std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>(*)(anurbs::NurbsCurveGeometry<2l>const&,std::vector<double,std::allocator<double>>),pybind11::arg,pybind11::arg>
          (class_<anurbs::KnotRefinement<2l>> *this,char *name_,
          _func_shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_NurbsCurveGeometry<2L>_ptr_vector<double,_std::allocator<double>_>
          **f,arg *extra,arg *extra_1)

{
  _func_shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_NurbsCurveGeometry<2L>_ptr_vector<double,_std::allocator<double>_>
  *f_00;
  cpp_function cf;
  handle local_70;
  handle local_68;
  cpp_function local_60;
  object local_58;
  object local_50;
  name local_48;
  handle local_40;
  handle local_38;
  object local_30;
  
  f_00 = *f;
  local_58.super_handle.m_ptr = *(handle *)this;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_48.value = name_;
  local_70.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_70.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_70.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_68.m_ptr = local_70.m_ptr;
  cpp_function::
  cpp_function<std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,anurbs::NurbsCurveGeometry<2l>const&,std::vector<double,std::allocator<double>>,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg>
            (&local_60,f_00,&local_48,(scope *)&local_58,(sibling *)&local_68,extra,extra_1);
  object::~object((object *)&local_70);
  object::~object(&local_50);
  staticmethod::staticmethod((staticmethod *)&local_68,(object *)&local_60);
  cpp_function::name((cpp_function *)&local_70);
  local_40.m_ptr = *(PyObject **)this;
  if (local_70.m_ptr != (PyObject *)0x0) {
    (local_70.m_ptr)->ob_refcnt = (local_70.m_ptr)->ob_refcnt + 1;
  }
  local_38.m_ptr = local_70.m_ptr;
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_30.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object(&local_58);
  detail::accessor_policies::obj_attr::set(local_40,local_38,local_68);
  object::~object(&local_30);
  object::~object((object *)&local_38);
  object::~object((object *)&local_70);
  object::~object((object *)&local_68);
  object::~object((object *)&local_60);
  return (class_<anurbs::KnotRefinement<2L>_> *)this;
}

Assistant:

class_ &
    def_static(const char *name_, Func &&f, const Extra&... extra) {
        static_assert(!std::is_member_function_pointer<Func>::value,
                "def_static(...) called with a non-static member function pointer");
        cpp_function cf(std::forward<Func>(f), name(name_), scope(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = staticmethod(cf);
        return *this;
    }